

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  
  uVar3 = *(uint *)&this->field_0;
  sVar6 = (size_t)((((uVar3 & 0x30) >> 4) - ((uVar3 & 0x30) >> 5)) * 2);
  if ((uVar3 & 0xf) != 0) {
    if ((uVar3 & 1) != 0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.input_type_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 4) != 0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.output_type_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      sVar4 = MethodOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t MethodDescriptorProto::ByteSizeLong() const {
  const MethodDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x00000030u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string input_type = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_input_type());
    }
    // optional string output_type = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_output_type());
    }
    // optional .google.protobuf.MethodOptions options = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}